

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::Grow(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
       *this)

{
  size_t sVar1;
  optional<std::pair<int,_int>_> *poVar2;
  pair<int,_int> *ppVar3;
  int iVar4;
  ulong uVar5;
  size_t i;
  size_t sVar6;
  ulong uVar7;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  newTable;
  polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_> local_38;
  
  sVar1 = (this->table).nStored;
  uVar5 = sVar1 * 2;
  local_38.memoryResource = (this->table).alloc.memoryResource;
  sVar6 = 0x40;
  if (0x40 < uVar5) {
    sVar6 = uVar5;
  }
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::vector(&newTable,sVar6,&local_38);
  for (sVar6 = 0; sVar6 != sVar1; sVar6 = sVar6 + 1) {
    poVar2 = (this->table).ptr;
    if (poVar2[sVar6].set == true) {
      ppVar3 = pstd::optional<std::pair<int,_int>_>::value(poVar2 + sVar6);
      uVar5 = 0;
      do {
        iVar4 = (int)uVar5;
        uVar7 = uVar5 >> 1;
        uVar5 = (ulong)(iVar4 + 1);
        uVar7 = (ulong)((uint)(iVar4 * iVar4) >> 1) +
                uVar7 + ((long)ppVar3->first & newTable.nStored - 1) & newTable.nStored - 1;
      } while (newTable.ptr[uVar7].set != false);
      ppVar3 = pstd::optional<std::pair<int,_int>_>::value((this->table).ptr + sVar6);
      pstd::optional<std::pair<int,_int>_>::operator=(newTable.ptr + uVar7,ppVar3);
    }
  }
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::operator=(&this->table,&newTable);
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::~vector(&newTable);
  return;
}

Assistant:

void Grow() {
        size_t currentCapacity = capacity();
        pstd::vector<TableEntry> newTable(std::max<size_t>(64, 2 * currentCapacity),
                                          table.get_allocator());
        size_t newCapacity = newTable.size();
        for (size_t i = 0; i < currentCapacity; ++i) {
            // Insert _table[i]_ into _newTable_ if it is set
            if (!table[i].has_value())
                continue;
            size_t baseOffset = Hash()(table[i]->first) & (newCapacity - 1);
            for (int nProbes = 0;; ++nProbes) {
                size_t offset = (baseOffset + nProbes / 2 + nProbes * nProbes / 2) &
                                (newCapacity - 1);
                if (!newTable[offset]) {
                    newTable[offset] = std::move(*table[i]);
                    break;
                }
            }
        }
        table = std::move(newTable);
    }